

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZOneShapeRestraint.h
# Opt level: O2

void __thiscall TPZOneShapeRestraint::Print(TPZOneShapeRestraint *this,ostream *out)

{
  ostream *poVar1;
  int i;
  long lVar2;
  
  std::operator<<(out,"TPZOneShapeRestraint ConnectIndex/Degree of freedom : ");
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x10) {
    poVar1 = std::ostream::_M_insert<long>((long)out);
    poVar1 = std::operator<<(poVar1,"/");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)((long)&((this->fFaces).super_TPZVec<std::pair<long,_int>_>.
                                               fStore)->second + lVar2));
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>(out);
  std::operator<<(out,"Orientation of each face ");
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    poVar1 = (ostream *)
             std::ostream::operator<<(out,(this->fOrient).super_TPZVec<int>.fStore[lVar2]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

void Print(std::ostream &out) const
    {
        out << "TPZOneShapeRestraint ConnectIndex/Degree of freedom : ";
        for(int i=0; i<4; i++) out << fFaces[i].first << "/" << fFaces[i].second << " ";
        out << std::endl;
        out << "Orientation of each face ";
        for(int i=0; i<4; i++) out << fOrient[i] << " ";
        out << std::endl;
    }